

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  ushort uVar1;
  function_record *pfVar2;
  pointer paVar3;
  type_info *ptVar4;
  long lVar5;
  PyTypeObject *pPVar6;
  handle obj;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  type_info *ptVar11;
  function_record *pfVar12;
  PyMethodDef *pPVar13;
  PyObject *pPVar14;
  PyObject *pPVar15;
  ushort uVar16;
  function_record *pfVar17;
  byte bVar18;
  uint uVar19;
  object *object;
  char *typeid_name;
  char *text_00;
  ulong uVar20;
  function_record *pfVar21;
  char cVar22;
  pointer paVar23;
  long lVar24;
  string func_name;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  capsule rec_capsule_1;
  object scope_module;
  undefined1 local_168 [24];
  object local_150;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_100 [24];
  object local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  size_t local_c0;
  str local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar2 = (unique_rec->_M_t).
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar10 = "";
  if (pfVar2->name != (char *)0x0) {
    pcVar10 = pfVar2->name;
  }
  local_c0 = args;
  pcVar10 = strdup_guard::operator()(&guarded_strdup,pcVar10);
  pfVar2->name = pcVar10;
  if (pfVar2->doc != (char *)0x0) {
    pcVar10 = strdup_guard::operator()(&guarded_strdup,pfVar2->doc);
    pfVar2->doc = pcVar10;
  }
  paVar3 = *(pointer *)
            ((long)&(pfVar2->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  for (paVar23 = (pfVar2->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start; paVar23 != paVar3;
      paVar23 = paVar23 + 0x20) {
    if (*(char **)paVar23 != (char *)0x0) {
      pcVar10 = strdup_guard::operator()(&guarded_strdup,*(char **)paVar23);
      *(char **)paVar23 = pcVar10;
    }
    if (*(char **)(paVar23 + 8) == (char *)0x0) {
      if (*(PyObject **)(paVar23 + 0x10) != (PyObject *)0x0) {
        repr((pybind11 *)&func_name,*(PyObject **)(paVar23 + 0x10));
        cast<std::__cxx11::string>(&signature,(pybind11 *)&func_name,object);
        pcVar10 = strdup_guard::operator()(&guarded_strdup,signature._M_dataplus._M_p);
        *(char **)(paVar23 + 8) = pcVar10;
        std::__cxx11::string::~string((string *)&signature);
        pybind11::object::~object((object *)&func_name);
      }
    }
    else {
      pcVar10 = strdup_guard::operator()(&guarded_strdup,*(char **)(paVar23 + 8));
      *(char **)(paVar23 + 8) = pcVar10;
    }
  }
  pcVar10 = pfVar2->name;
  iVar9 = strcmp(pcVar10,"__init__");
  if (iVar9 == 0) {
    uVar16 = 1;
  }
  else {
    iVar9 = strcmp(pcVar10,"__setstate__");
    uVar16 = (ushort)(iVar9 == 0);
  }
  uVar1 = *(ushort *)&pfVar2->field_0x59;
  uVar19 = uVar1 & 0xfffffffe | (uint)uVar16;
  *(short *)&pfVar2->field_0x59 = (short)uVar19;
  if (((uVar1 & 2) == 0 & (byte)uVar16) == 1) {
    detail::get_fully_qualified_tp_name_abi_cxx11_
              (&signature,(detail *)(pfVar2->scope).m_ptr,(PyTypeObject *)(ulong)uVar19);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&func_name,pfVar2->name,(allocator<char> *)&rec_capsule_1);
    uVar7 = _PyExc_FutureWarning;
    std::operator+(&local_e0,"pybind11-bound class \'",&signature);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                   &local_e0,"\' is using an old-style placement-new \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                   &func_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rec_capsule_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   "\' which has been deprecated. See the upgrade guide in pybind11\'s docs. This message is only visible when compiled in debug mode."
                  );
    PyErr_WarnEx(uVar7,rec_capsule_1.super_object.super_handle.m_ptr,0);
    std::__cxx11::string::~string((string *)&rec_capsule_1);
    std::__cxx11::string::~string((string *)&scope_module);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&func_name);
    std::__cxx11::string::~string((string *)&signature);
  }
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  signature._M_string_length = 0;
  signature.field_2._M_local_buf[0] = '\0';
  pcVar10 = text + 1;
  bVar8 = false;
  uVar20 = 0;
  lVar24 = 0;
  do {
    cVar22 = pcVar10[-1];
    if (cVar22 == '%') {
      ptVar4 = types[lVar24];
      if (ptVar4 == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      func_name._M_dataplus._M_p = (pointer)ptVar4;
      ptVar11 = detail::get_type_info((type_index *)&func_name,false);
      lVar24 = lVar24 + 1;
      if (ptVar11 == (type_info *)0x0) {
        if (((pfVar2->field_0x59 & 2) == 0) || (uVar20 != 0)) {
          detail::clean_type_id_abi_cxx11_
                    ((string *)&rec_capsule_1,
                     (detail *)(*(char **)(ptVar4 + 8) + (**(char **)(ptVar4 + 8) == '*')),
                     typeid_name);
          std::__cxx11::string::string((string *)&func_name,(string *)&rec_capsule_1);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&func_name);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
        }
        else {
          local_168._8_8_ = (pfVar2->scope).m_ptr;
          local_168._16_8_ = "__module__";
          local_150.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scope_module,
                     (accessor<pybind11::detail::accessor_policies::str_attr> *)local_168);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,".");
          local_100._8_8_ = (pfVar2->scope).m_ptr;
          local_100._16_8_ = "__qualname__";
          local_e8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    (&local_e0,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_100)
          ;
          std::operator+(&func_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,&local_e0);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&func_name);
          std::__cxx11::string::~string((string *)&local_e0);
          pybind11::object::~object(&local_e8);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
          std::__cxx11::string::~string((string *)&scope_module);
          pybind11::object::~object(&local_150);
          uVar20 = 0;
        }
      }
      else {
        pPVar6 = ptVar11->type;
        local_168._16_8_ = "__module__";
        local_150.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_168._8_8_ = pPVar6;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   (accessor<pybind11::detail::accessor_policies::str_attr> *)local_168);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module,".");
        local_100._16_8_ = "__qualname__";
        local_e8.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_100._8_8_ = pPVar6;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_e0,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_100);
        std::operator+(&func_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,&local_e0);
        std::__cxx11::string::append((string *)&signature);
        std::__cxx11::string::~string((string *)&func_name);
        std::__cxx11::string::~string((string *)&local_e0);
        pybind11::object::~object(&local_e8);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
        pybind11::object::~object(&local_150);
      }
    }
    else if (cVar22 == '{') {
      bVar8 = true;
      if (*pcVar10 != '*') {
        if (((pfVar2->field_0x59 & 0x40) == 0) && (uVar20 == pfVar2->nargs_pos)) {
          std::__cxx11::string::append((char *)&signature);
        }
        lVar5 = *(long *)&(pfVar2->args).
                          super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          ._M_impl.super__Vector_impl_data;
        if (((uVar20 < (ulong)((long)*(pointer *)
                                      ((long)&(pfVar2->args).
                                              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                      + 8) - lVar5 >> 5)) && (*(long *)(lVar5 + uVar20 * 0x20) != 0)
            ) || ((*(ushort *)&pfVar2->field_0x59 & 0x10) != 0 && uVar20 == 0)) {
          std::__cxx11::string::append((char *)&signature);
        }
        else {
          std::__cxx11::to_string
                    ((string *)&rec_capsule_1,
                     uVar20 - ((*(ushort *)&pfVar2->field_0x59 >> 4 & 1) != 0));
          std::operator+(&func_name,"arg",(string *)&rec_capsule_1);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&func_name);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
        }
        std::__cxx11::string::append((char *)&signature);
        bVar8 = false;
      }
    }
    else if (cVar22 == '}') {
      if (((!bVar8) &&
          (lVar5 = *(long *)&(pfVar2->args).
                             super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                             ._M_impl.super__Vector_impl_data,
          uVar20 < (ulong)((long)*(pointer *)
                                  ((long)&(pfVar2->args).
                                          super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  + 8) - lVar5 >> 5))) &&
         (*(long *)(lVar5 + uVar20 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append((char *)&signature);
        detail::replace_newlines_and_squash_abi_cxx11_
                  (&func_name,
                   *(detail **)
                    ((pfVar2->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar20 * 0x20 + 8),text_00);
        std::__cxx11::string::append((string *)&signature);
        std::__cxx11::string::~string((string *)&func_name);
      }
      if (((ulong)pfVar2->nargs_pos_only != 0) && (uVar20 + 1 == (ulong)pfVar2->nargs_pos_only)) {
        std::__cxx11::string::append((char *)&signature);
      }
      if (!bVar8) {
        uVar20 = uVar20 + 1;
      }
    }
    else {
      if (cVar22 == '\0') break;
      std::__cxx11::string::push_back((char)&signature);
    }
    pcVar10 = pcVar10 + 1;
  } while( true );
  if ((uVar20 != (local_c0 - (*(ushort *)&pfVar2->field_0x59 >> 6 & 1)) -
                 (ulong)((*(ushort *)&pfVar2->field_0x59 >> 7 & 1) != 0)) ||
     (types[lVar24] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar10 = strdup_guard::operator()(&guarded_strdup,signature._M_dataplus._M_p);
  pfVar2->signature = pcVar10;
  std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  ::_M_shrink_to_fit(&pfVar2->args);
  pfVar2->nargs = (uint16_t)local_c0;
  pPVar14 = (pfVar2->sibling).m_ptr;
  if (pPVar14 != (PyObject *)0x0) {
    if (pPVar14->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar14 = (PyObject *)pPVar14[1].ob_refcnt;
      (pfVar2->sibling).m_ptr = pPVar14;
      if (pPVar14 == (PyObject *)0x0) goto LAB_00140d51;
    }
    iVar9 = _PyObject_TypeCheck(pPVar14,(PyTypeObject *)&PyCFunction_Type);
    pPVar14 = (pfVar2->sibling).m_ptr;
    if (iVar9 == 0) {
      if ((pPVar14 != (PyObject *)&_Py_NoneStruct) && (*pfVar2->name != '_')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&scope_module,pfVar2->name,(allocator<char> *)local_168);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,"Cannot overload existing non-function object \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module);
        std::operator+(&func_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,"\" with a function of the same name");
        pybind11_fail(&func_name);
      }
    }
    else if ((((*(byte *)(pPVar14[1].ob_refcnt + 0x10) & 0x20) == 0) &&
             (pPVar6 = pPVar14[1].ob_type, pPVar6 != (PyTypeObject *)0x0)) &&
            ((pPVar6->ob_base).ob_base.ob_type == (PyTypeObject *)&PyCapsule_Type)) {
      func_name._M_dataplus._M_p = (pointer)pPVar6;
      handle::inc_ref((handle *)&func_name);
      bVar8 = detail::is_function_record_capsule((capsule *)&func_name);
      if (bVar8) {
        pfVar12 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)&func_name);
        pfVar21 = (function_record *)0x0;
        if ((pfVar12->scope).m_ptr == (pfVar2->scope).m_ptr) {
          pfVar21 = pfVar12;
        }
      }
      else {
        pfVar21 = (function_record *)0x0;
      }
      pybind11::object::~object((object *)&func_name);
      if (pfVar21 != (function_record *)0x0) {
        (this->super_function).super_object.super_handle.m_ptr = (pfVar2->sibling).m_ptr;
        handle::inc_ref((handle *)this);
        uVar16 = *(ushort *)&pfVar2->field_0x59;
        if (((*(ushort *)&pfVar21->field_0x59 ^ uVar16) & 0x10) != 0) {
          pcVar10 = "instance";
          if ((uVar16 & 0x10) == 0) {
            pcVar10 = "static";
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar10,&local_1c1)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,
                         "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                         ,&local_70);
          std::operator+(&local_e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100," method ");
          local_50.obj.m_ptr = (pfVar2->scope).m_ptr;
          local_50.key = "__name__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          str::str<pybind11::detail::accessor_policies::str_attr>(&local_b8,&local_50);
          str::operator_cast_to_string(&local_90,&local_b8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168,&local_e0,&local_90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168,".");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pfVar2->name,&local_1c2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,&local_b0);
          std::operator+(&func_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,&signature);
          pybind11_fail(&func_name);
        }
        pfVar12 = pfVar21;
        if ((uVar16 >> 8 & 1) == 0) {
          do {
            pfVar17 = pfVar12;
            pfVar12 = pfVar17->next;
          } while (pfVar12 != (function_record *)0x0);
          pfVar12 = (unique_rec->_M_t).
                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (unique_rec->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          pfVar17->next = pfVar12;
          if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        else {
          pfVar2->next = pfVar21;
          func_name._M_dataplus._M_p =
               (pointer)(this->super_function).super_object.super_handle.m_ptr[1].ob_type;
          handle::inc_ref((handle *)&func_name);
          pfVar21 = (unique_rec->_M_t).
                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (unique_rec->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          capsule::set_pointer((capsule *)&func_name,pfVar21);
          if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pybind11::object::~object((object *)&func_name);
          pfVar21 = pfVar2;
        }
        func_name._M_dataplus._M_p = (pointer)&func_name.field_2;
        func_name._M_string_length = 0;
        func_name.field_2._M_allocated_capacity =
             func_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (DAT_00169b11 == 1) {
          std::__cxx11::string::append((char *)&func_name);
          std::__cxx11::string::append((char *)&func_name);
          std::__cxx11::string::append((char *)&func_name);
        }
        bVar8 = false;
        goto LAB_00140ec3;
      }
    }
  }
LAB_00140d51:
  pPVar13 = (PyMethodDef *)operator_new(0x20);
  pfVar2->def = pPVar13;
  *(undefined8 *)&pPVar13->ml_flags = 0;
  pPVar13->ml_doc = (char *)0x0;
  pPVar13->ml_name = pfVar2->name;
  pPVar13->ml_meth = dispatcher;
  pPVar13->ml_flags = 3;
  pfVar21 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  (unique_rec->_M_t).
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (function_record *)0x0;
  capsule::capsule(&rec_capsule_1,pfVar21,(char *)0x0,
                   initialize_generic::anon_class_1_0_00000001::__invoke);
  if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  scope_module.super_handle.m_ptr = (handle)(PyObject *)0x0;
  obj.m_ptr = (pfVar2->scope).m_ptr;
  if (obj.m_ptr != (PyObject *)0x0) {
    bVar8 = hasattr(obj,"__module__");
    if (bVar8) {
      func_name._M_string_length = (size_type)(pfVar2->scope).m_ptr;
      func_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_86015;
      func_name.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_168);
    }
    else {
      bVar8 = hasattr((pfVar2->scope).m_ptr,"__name__");
      if (!bVar8) goto LAB_00140e6f;
      func_name._M_string_length = (size_type)(pfVar2->scope).m_ptr;
      func_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_86a12;
      func_name.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_168);
    }
    pybind11::object::operator=(&scope_module,(object *)local_168);
    pybind11::object::~object((object *)local_168);
    pybind11::object::~object((object *)((long)&func_name.field_2 + 8));
  }
LAB_00140e6f:
  pPVar14 = (PyObject *)
            PyCMethod_New(pfVar2->def,rec_capsule_1.super_object.super_handle.m_ptr,
                          scope_module.super_handle.m_ptr,0);
  (this->super_function).super_object.super_handle.m_ptr = pPVar14;
  if (pPVar14 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object(&scope_module);
  pybind11::object::~object(&rec_capsule_1.super_object);
  func_name._M_dataplus._M_p = (pointer)&func_name.field_2;
  func_name._M_string_length = 0;
  func_name.field_2._M_allocated_capacity =
       func_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar8 = true;
  pfVar21 = pfVar2;
LAB_00140ec3:
  bVar18 = 1;
  iVar9 = 0;
  for (; pfVar21 != (function_record *)0x0; pfVar21 = pfVar21->next) {
    cVar22 = (char)&func_name;
    if (DAT_00169b11 == 1) {
      if (0 < iVar9) {
        std::__cxx11::string::push_back(cVar22);
      }
      if (!bVar8) {
        iVar9 = iVar9 + 1;
        std::__cxx11::to_string((string *)&scope_module,iVar9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,(string *)&scope_module,". ");
        std::__cxx11::string::append((string *)&func_name);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
      }
      std::__cxx11::string::append((char *)&func_name);
      std::__cxx11::string::append((char *)&func_name);
      std::__cxx11::string::push_back(cVar22);
    }
    if (((pfVar21->doc != (char *)0x0) && (*pfVar21->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if ((DAT_00169b11 & 1) == 0 && bVar18 == 0) {
        std::__cxx11::string::push_back(cVar22);
        bVar18 = 0;
      }
      else {
        bVar18 = bVar18 & DAT_00169b11;
      }
      if ((DAT_00169b11 & 1) != 0) {
        std::__cxx11::string::push_back(cVar22);
      }
      std::__cxx11::string::append((char *)&func_name);
      if (DAT_00169b11 == 1) {
        std::__cxx11::string::push_back(cVar22);
      }
    }
  }
  pPVar14 = (this->super_function).super_object.super_handle.m_ptr;
  free(*(void **)(pPVar14[1].ob_refcnt + 0x18));
  if (func_name._M_string_length == 0) {
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = strdup(func_name._M_dataplus._M_p);
  }
  *(char **)(pPVar14[1].ob_refcnt + 0x18) = pcVar10;
  if ((pfVar2->field_0x59 & 0x10) != 0) {
    pPVar15 = (PyObject *)
              PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
    (this->super_function).super_object.super_handle.m_ptr = pPVar15;
    if (pPVar15 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    _Py_DECREF(pPVar14);
  }
  std::__cxx11::string::~string((string *)&func_name);
  std::__cxx11::string::~string((string *)&signature);
  strdup_guard::~strdup_guard(&guarded_strdup);
  return;
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += detail::replace_newlines_and_squash(rec->args[arg_index].descr);
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    signature += detail::quote_cpp_type_name(detail::clean_type_id(t->name()));
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                detail::get_function_record_capsule_name(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }